

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O0

PixelBufferAccess * __thiscall
deqp::gles31::Functional::anon_unknown_1::LayeredImage::getAccessInternal
          (PixelBufferAccess *__return_storage_ptr__,LayeredImage *this)

{
  Texture1D *this_00;
  PixelBufferAccess *pPVar1;
  Texture2D *this_01;
  Texture3D *this_02;
  Texture2DArray *this_03;
  LayeredImage *this_local;
  
  if (this->m_type == TEXTURETYPE_BUFFER) {
    this_00 = de::SharedPtr<tcu::Texture1D>::operator->(&this->m_texBuffer);
    pPVar1 = tcu::TextureLevelPyramid::getLevel(&this_00->super_TextureLevelPyramid,0);
    tcu::PixelBufferAccess::PixelBufferAccess(__return_storage_ptr__,pPVar1);
  }
  else if (this->m_type == TEXTURETYPE_2D) {
    this_01 = de::SharedPtr<tcu::Texture2D>::operator->(&this->m_tex2D);
    pPVar1 = tcu::TextureLevelPyramid::getLevel(&this_01->super_TextureLevelPyramid,0);
    tcu::PixelBufferAccess::PixelBufferAccess(__return_storage_ptr__,pPVar1);
  }
  else if (this->m_type == TEXTURETYPE_3D) {
    this_02 = de::SharedPtr<tcu::Texture3D>::operator->(&this->m_tex3D);
    pPVar1 = tcu::TextureLevelPyramid::getLevel(&this_02->super_TextureLevelPyramid,0);
    tcu::PixelBufferAccess::PixelBufferAccess(__return_storage_ptr__,pPVar1);
  }
  else if (this->m_type == TEXTURETYPE_2D_ARRAY) {
    this_03 = de::SharedPtr<tcu::Texture2DArray>::operator->(&this->m_tex2DArray);
    pPVar1 = tcu::TextureLevelPyramid::getLevel(&this_03->super_TextureLevelPyramid,0);
    tcu::PixelBufferAccess::PixelBufferAccess(__return_storage_ptr__,pPVar1);
  }
  else {
    tcu::PixelBufferAccess::PixelBufferAccess(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

PixelBufferAccess LayeredImage::getAccessInternal (void) const
{
	DE_ASSERT(m_type == TEXTURETYPE_BUFFER || m_type == TEXTURETYPE_2D || m_type == TEXTURETYPE_3D || m_type == TEXTURETYPE_2D_ARRAY);

	return m_type == TEXTURETYPE_BUFFER		? m_texBuffer->getLevel(0)
		 : m_type == TEXTURETYPE_2D			? m_tex2D->getLevel(0)
		 : m_type == TEXTURETYPE_3D			? m_tex3D->getLevel(0)
		 : m_type == TEXTURETYPE_2D_ARRAY	? m_tex2DArray->getLevel(0)
		 : PixelBufferAccess();
}